

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

uchar * mcmrealo(mcmcxdef *cctx,mcmon cliobj,ushort newsize)

{
  ushort n;
  ushort uVar1;
  ushort n_00;
  undefined2 uVar2;
  mcmodef *pmVar3;
  mcmcx1def *ctx;
  uchar *__dest;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ushort siz;
  undefined6 in_register_00000032;
  long *plVar7;
  mcmon nxt;
  errdef fr_;
  ushort local_17c;
  mcmon local_17a;
  mcmcx1def *local_178;
  mcmcxdef *local_170;
  errdef local_168;
  
  local_178 = cctx->mcmcxgl;
  n = cctx->mcmcxmtb[CONCAT62(in_register_00000032,cliobj) >> 8 & 0xffffff]
      [(uint)CONCAT62(in_register_00000032,cliobj) & 0xff];
  pmVar3 = local_178->mcmcxtab[n >> 8];
  uVar5 = (ulong)((n & 0xff) << 5);
  uVar1 = *(ushort *)((long)&pmVar3->mcmoflg + uVar5);
  local_17a = cliobj;
  if ((uVar1 & 4) == 0) {
    mcmlck(cctx,cliobj);
  }
  local_170 = cctx;
  local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
  ctx = local_178;
  if (local_168.errcode != 0) {
    local_178->mcmcxerr->errcxptr = local_168.errprv;
    if ((uVar1 & 4) == 0) {
      mcmunlck(local_170,local_17a);
    }
    errrse1(local_178->mcmcxerr,&local_168);
  }
  siz = (ushort)(newsize + 7) & 0xfff8;
  plVar7 = (long *)((long)&pmVar3->mcmoptr + uVar5);
  local_168.errprv = local_178->mcmcxerr->errcxptr;
  local_178->mcmcxerr->errcxptr = &local_168;
  uVar4 = newsize + 7 & 0xfff8;
  uVar1 = *(ushort *)(plVar7 + 3);
  if (uVar1 <= uVar4) {
    n_00 = *(ushort *)(*plVar7 + (ulong)uVar1);
    local_17c = n_00;
    if ((((n_00 == 0xffff) || (pmVar3 = local_178->mcmcxtab[n_00 >> 8], pmVar3 == (mcmodef *)0x0))
        || (bVar6 = (byte)n_00, (pmVar3[bVar6].mcmoflg & 0x80) == 0)) ||
       ((int)(uint)pmVar3[bVar6].mcmosiz < (int)(uVar4 - uVar1))) {
      if (*(char *)((long)plVar7 + 0x16) != '\x01') {
        errsigf(local_178->mcmcxerr,"TADS",5);
      }
      __dest = mcmalo0(local_170,siz,&local_17c,0xffff,1);
      if (local_17c == 0xffff) {
        errsigf(ctx->mcmcxerr,"TADS",0xc);
      }
      memcpy(__dest,(void *)*plVar7,(ulong)*(ushort *)(plVar7 + 3));
      pmVar3 = ctx->mcmcxtab[local_17c >> 8];
      uVar5 = (ulong)((local_17c & 0xff) << 5);
      uVar2 = *(undefined2 *)((long)&pmVar3->mcmosiz + uVar5);
      *(long *)((long)&pmVar3->mcmoptr + uVar5) = *plVar7;
      *(short *)((long)&pmVar3->mcmosiz + uVar5) = (short)plVar7[3];
      *plVar7 = (long)__dest;
      *(undefined2 *)(plVar7 + 3) = uVar2;
      *(ushort *)(__dest + -8) = n;
      *(ushort *)(*(long *)((long)&pmVar3->mcmoptr + uVar5) + -8) = local_17c;
      mcmgunlck(ctx,local_17c);
      mcmgfre(ctx,local_17c);
      goto LAB_00215071;
    }
    *(ushort *)(plVar7 + 3) = uVar1 + pmVar3[bVar6].mcmosiz + 8;
    mcmunl(local_178,n_00,&local_178->mcmcxfre);
    pmVar3[bVar6].mcmonxt = ctx->mcmcxunu;
    ctx->mcmcxunu = n_00;
    pmVar3[bVar6].mcmoflg = 0;
  }
  mcmsplt(ctx,n,siz);
LAB_00215071:
  ctx->mcmcxerr->errcxptr = local_168.errprv;
  return (uchar *)*plVar7;
}

Assistant:

uchar *mcmrealo(mcmcxdef *cctx, mcmon cliobj, ushort newsize)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      obj = mcmc2g(cctx, cliobj); 
    mcmodef   *o = mcmgobje(ctx, obj);
    mcmon      nxt;
    mcmodef   *nxto;
    uchar     *p;
    int        local_lock;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    newsize = osrndsz(newsize);
    
    /* make sure the object is locked, and note if we locked it */
    if ((local_lock = !(o->mcmoflg & MCMOFLOCK)) != 0)
        (void)mcmlck(cctx, cliobj);
    
    ERRBEGIN(ctx->mcmcxerr)
    
    if (newsize < o->mcmosiz)
        mcmsplt(ctx, obj, newsize);            /* smaller; just split block */
    else
    {
        /* see if there's a free block after this block */
        p = o->mcmoptr;
        nxt = *(mcmon *)(p + o->mcmosiz);
        nxto = (nxt == MCMONINV) ? (mcmodef *)0 : mcmgobje(ctx, nxt);
        
        if (nxto && ((nxto->mcmoflg & MCMOFFREE)
                     && nxto->mcmosiz >= newsize - o->mcmosiz))
        {
            /* sanity check - make sure heap and page table agree */
            assert(nxto->mcmoptr == p + o->mcmosiz + osrndsz(sizeof(mcmon)));
            /* annex the free block */
            o->mcmosiz += nxto->mcmosiz + osrndsz(sizeof(mcmon));
            /* move the free block to the unused list */
            mcmunl(ctx, nxt, &ctx->mcmcxfre);
            nxto->mcmonxt = ctx->mcmcxunu;
            ctx->mcmcxunu = nxt;
            nxto->mcmoflg = 0;
            
            /* split the newly grown block if necessary */
            mcmsplt(ctx, obj, newsize);
        }
        else
        {
            /* can't annex; allocate new memory and copy */
            
            if (o->mcmolcnt != 1)           /* if anyone else has a lock... */
                errsig(ctx->mcmcxerr, ERR_REALCK);      /* we can't move it */
    
            p = mcmalo0(cctx, newsize, &nxt, MCMONINV, TRUE);
            if (nxt == MCMONINV) errsig(ctx->mcmcxerr, ERR_NOMEM2);
            memcpy(p, o->mcmoptr, (size_t)o->mcmosiz);
            
            /* adjust the object entries */
            nxto = mcmgobje(ctx, nxt);          /* get pointer to new entry */
            newsize = nxto->mcmosiz;        /* get actual size of new block */
            nxto->mcmoptr = o->mcmoptr;   /* copy current block info to new */
            nxto->mcmosiz = o->mcmosiz;
            o->mcmoptr = p;        /* copy new block info to original entry */
            o->mcmosiz = newsize;
            
            /* now fix up the heap pointers, and free the temp object */
            *(mcmon *)(p - osrndsz(sizeof(mcmon))) = obj;
            *(mcmon *)(nxto->mcmoptr - osrndsz(sizeof(mcmon))) = nxt;
            mcmgunlck(ctx, nxt);
            mcmgfre(ctx, nxt);
        }
    }
    
    ERRCLEAN(ctx->mcmcxerr)
        /* release our lock, if we had to obtain one */
        if (local_lock) mcmunlck(cctx, cliobj);
    ERRENDCLN(ctx->mcmcxerr)
    
    /* return the address of the object */
    return(o->mcmoptr);
}